

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O0

Roaring * __thiscall roaring::Roaring::operator-(Roaring *this,Roaring *o)

{
  roaring_bitmap_t *prVar1;
  runtime_error *this_00;
  Roaring *in_RDI;
  roaring_bitmap_t *r;
  roaring_bitmap_t *in_stack_00000050;
  roaring_bitmap_t *in_stack_00000058;
  roaring_bitmap_t *in_stack_ffffffffffffffb8;
  Roaring *this_01;
  
  this_01 = in_RDI;
  prVar1 = roaring_bitmap_andnot(in_stack_00000058,in_stack_00000050);
  if (prVar1 == (roaring_bitmap_t *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"failed materalization in andnot");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Roaring(this_01,in_stack_ffffffffffffffb8);
  return in_RDI;
}

Assistant:

Roaring operator-(const Roaring &o) const {
        roaring_bitmap_t *r = api::roaring_bitmap_andnot(&roaring, &o.roaring);
        if (r == NULL) {
            ROARING_TERMINATE("failed materalization in andnot");
        }
        return Roaring(r);
    }